

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O1

void __thiscall fw::Shader::compile(Shader *this,GLenum shaderType)

{
  pointer pbVar1;
  GLuint GVar2;
  ostream *poVar3;
  size_t sVar4;
  pointer str;
  GLint success;
  vector<const_char_*,_std::allocator<const_char_*>_> transformedSources;
  GLchar infoLog [512];
  int local_25c;
  GLchar **local_258;
  long lStack_250;
  long local_248;
  char *local_238 [65];
  
  local_258 = (GLchar **)0x0;
  lStack_250 = 0;
  local_248 = 0;
  str = (this->_sources).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->_sources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (str != pbVar1) {
    do {
      local_238[0] = transformStringToCStr(str);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_258,local_238);
      str = str + 1;
    } while (str != pbVar1);
  }
  GVar2 = (*glad_glCreateShader)(shaderType);
  (*glad_glShaderSource)
            (GVar2,(GLsizei)((ulong)(lStack_250 - (long)local_258) >> 3),local_258,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_25c);
  if (local_25c == 0) {
    (*glad_glGetShaderInfoLog)(GVar2,0x200,(GLsizei *)0x0,(GLchar *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Shader compilation failed",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    poVar3 = (ostream *)std::ostream::flush();
    sVar4 = strlen((char *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_238,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    this->_shaderType = shaderType;
    this->_shaderId = GVar2;
  }
  if (local_258 != (GLchar **)0x0) {
    operator_delete(local_258,local_248 - (long)local_258);
  }
  return;
}

Assistant:

void Shader::compile(GLenum shaderType)
{
    vector<const char *> transformedSources;

    transform(
        _sources.begin(),
        _sources.end(),
        back_inserter(transformedSources),
        transformStringToCStr
    );

    GLuint shader = glCreateShader(shaderType);

    glShaderSource(
        shader,
        transformedSources.size(),
        transformedSources.data(),
        nullptr
    );

    glCompileShader(shader);

    GLint success;
    GLchar infoLog[512];
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (!success) {
        glGetShaderInfoLog(shader, 512, nullptr, infoLog);
        std::cout << "Error: Shader compilation failed" << std::endl
            << infoLog << std::endl;
        return; // todo: throw exception
    }

    _shaderType = shaderType;
    _shaderId = shader;
}